

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfilters.c
# Opt level: O2

void Curl_conn_cf_insert_after(Curl_cfilter *cf_at,Curl_cfilter *cf_new)

{
  int iVar1;
  Curl_cfilter *pCVar2;
  connectdata *pcVar3;
  Curl_cfilter *pCVar4;
  
  pCVar2 = cf_at->next;
  pcVar3 = cf_at->conn;
  cf_at->next = cf_new;
  iVar1 = cf_at->sockindex;
  do {
    pCVar4 = cf_new;
    pCVar4->conn = pcVar3;
    pCVar4->sockindex = iVar1;
    cf_new = pCVar4->next;
  } while (pCVar4->next != (Curl_cfilter *)0x0);
  pCVar4->next = pCVar2;
  return;
}

Assistant:

void Curl_conn_cf_insert_after(struct Curl_cfilter *cf_at,
                               struct Curl_cfilter *cf_new)
{
  struct Curl_cfilter *tail, **pnext;

  DEBUGASSERT(cf_at);
  DEBUGASSERT(cf_new);
  DEBUGASSERT(!cf_new->conn);

  tail = cf_at->next;
  cf_at->next = cf_new;
  do {
    cf_new->conn = cf_at->conn;
    cf_new->sockindex = cf_at->sockindex;
    pnext = &cf_new->next;
    cf_new = cf_new->next;
  } while(cf_new);
  *pnext = tail;
}